

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderAtomicCountersTests.cpp
# Opt level: O3

long __thiscall glcts::AdvancedUsageDrawUpdateDraw::Run(AdvancedUsageDrawUpdateDraw *this)

{
  CallLogWrapper *this_00;
  uint uVar1;
  bool bVar2;
  GLuint GVar3;
  undefined8 *puVar4;
  GLuint *ebo;
  long lVar5;
  GLint p2;
  GLint p1;
  string local_450;
  GLenum draw_buffers [2];
  UVec4 data [64];
  
  this_00 = &(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(this_00,0x92d0,&p1);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x92d6,&p2);
  if ((p1 < 1) || (p2 < 2)) {
    local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_450,
               "GL_MAX_FRAGMENT_ATOMIC_COUNTER_BUFFERS or GL_MAX_FRAGMENT_ATOMIC_COUNTERS are less than required"
               ,"");
    deqp::SubcaseBase::OutputNotSupported((SubcaseBase *)this,&local_450);
    lVar5 = 0x10;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    GVar3 = glcts::anon_unknown_0::SACSubcaseBase::CreateProgram
                      (&this->super_SACSubcaseBase,
                       "#version 310 es\nlayout(location = 0) in vec4 i_vertex;\nvoid main() {\n  gl_Position = i_vertex;\n}"
                       ,
                       "#version 310 es\nlayout(location = 0) out uvec4 o_color[2];\nlayout(binding = 0) uniform atomic_uint ac_counter[2];\nvoid main() {\n  o_color[0] = uvec4(atomicCounterIncrement(ac_counter[0]));\n  o_color[1] = uvec4(atomicCounterDecrement(ac_counter[1]));\n}"
                       ,true);
    this->prog_ = GVar3;
    GVar3 = glcts::anon_unknown_0::SACSubcaseBase::CreateProgram
                      (&this->super_SACSubcaseBase,
                       "#version 310 es\nlayout(location = 0) in vec4 i_vertex;\nvoid main() {\n  gl_Position = i_vertex;\n}"
                       ,
                       "#version 310 es\nlayout(location = 0) out uvec4 o_color[2];\nlayout(binding = 0) uniform atomic_uint ac_counter[2];\nvoid main() {\n  o_color[0] = uvec4(atomicCounter(ac_counter[0]));\n  o_color[1] = uvec4(atomicCounter(ac_counter[1]));\n}"
                       ,true);
    this->prog2_ = GVar3;
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->counter_buffer_);
    glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,this->counter_buffer_);
    lVar5 = 0;
    glu::CallLogWrapper::glBufferData(this_00,0x92c0,8,(void *)0x0,0x88ea);
    glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,0);
    glu::CallLogWrapper::glGenTextures(this_00,2,this->rt_);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,this->rt_[0]);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
    glu::CallLogWrapper::glTexImage2D(this_00,0xde1,0,0x8236,8,8,0,0x8d94,0x1405,(void *)0x0);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,this->rt_[1]);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
    glu::CallLogWrapper::glTexImage2D(this_00,0xde1,0,0x8236,8,8,0,0x8d94,0x1405,(void *)0x0);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
    glu::CallLogWrapper::glGenFramebuffers(this_00,1,&this->fbo_);
    glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,this->fbo_);
    glu::CallLogWrapper::glFramebufferTexture2D(this_00,0x8d40,0x8ce0,0xde1,this->rt_[0],0);
    ebo = (GLuint *)0xde1;
    glu::CallLogWrapper::glFramebufferTexture2D(this_00,0x8d40,0x8ce1,0xde1,this->rt_[1],0);
    draw_buffers[0] = 0x8ce0;
    draw_buffers[1] = 0x8ce1;
    glu::CallLogWrapper::glDrawBuffers(this_00,2,draw_buffers);
    glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,0);
    glcts::anon_unknown_0::SACSubcaseBase::CreateQuad
              (&this->super_SACSubcaseBase,&this->vao_,&this->vbo_,ebo);
    glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,this->counter_buffer_);
    puVar4 = (undefined8 *)glu::CallLogWrapper::glMapBufferRange(this_00,0x92c0,0,8,10);
    *puVar4 = 0x10000000100;
    glu::CallLogWrapper::glUnmapBuffer(this_00,0x92c0);
    glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,this->fbo_);
    glu::CallLogWrapper::glViewport(this_00,0,0,8,8);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x92c0,0,this->counter_buffer_);
    glu::CallLogWrapper::glUseProgram(this_00,this->prog_);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->vao_);
    glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
    glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,this->counter_buffer_);
    puVar4 = (undefined8 *)glu::CallLogWrapper::glMapBufferRange(this_00,0x92c0,0,8,3);
    *puVar4 = CONCAT44((int)((ulong)*puVar4 >> 0x20) + 0x400,(int)*puVar4 + 0x200);
    glu::CallLogWrapper::glUnmapBuffer(this_00,0x92c0);
    glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x1000);
    glu::CallLogWrapper::glUseProgram(this_00,this->prog2_);
    glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
    memset(data,0,0x400);
    glu::CallLogWrapper::glReadBuffer(this_00,0x8ce0);
    glu::CallLogWrapper::glReadPixels(this_00,0,0,8,8,0x8d99,0x1405,data);
    do {
      uVar1 = *(uint *)((long)data[0].m_data + lVar5);
      if (uVar1 != 0x380) goto LAB_00c41965;
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x400);
    glu::CallLogWrapper::glReadBuffer(this_00,0x8ce1);
    lVar5 = 0;
    glu::CallLogWrapper::glReadPixels(this_00,0,0,8,8,0x8d99,0x1405,data);
    do {
      uVar1 = *(uint *)((long)data[0].m_data + lVar5);
      if (uVar1 != 0x480) {
LAB_00c41965:
        glcts::anon_unknown_0::Output("Counter value is %u should be %u.\n",(ulong)uVar1,0x380);
        return -1;
      }
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x400);
    bVar2 = glcts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                      (&this->super_SACSubcaseBase,this->counter_buffer_,0,0x380);
    lVar5 = -1;
    if (bVar2) {
      bVar2 = glcts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                        (&this->super_SACSubcaseBase,this->counter_buffer_,4,0x480);
      lVar5 = (ulong)bVar2 - 1;
    }
  }
  return lVar5;
}

Assistant:

virtual long Run()
	{

		GLint p1, p2;
		glGetIntegerv(GL_MAX_FRAGMENT_ATOMIC_COUNTER_BUFFERS, &p1);
		glGetIntegerv(GL_MAX_FRAGMENT_ATOMIC_COUNTERS, &p2);
		if (p1 < 1 || p2 < 2)
		{
			OutputNotSupported(
				"GL_MAX_FRAGMENT_ATOMIC_COUNTER_BUFFERS or GL_MAX_FRAGMENT_ATOMIC_COUNTERS are less than required");
			return NOT_SUPPORTED;
		}

		// create program
		const char* src_vs = "#version 310 es" NL "layout(location = 0) in vec4 i_vertex;" NL "void main() {" NL
							 "  gl_Position = i_vertex;" NL "}";
		const char* src_fs = "#version 310 es" NL "layout(location = 0) out uvec4 o_color[2];" NL
							 "layout(binding = 0) uniform atomic_uint ac_counter[2];" NL "void main() {" NL
							 "  o_color[0] = uvec4(atomicCounterIncrement(ac_counter[0]));" NL
							 "  o_color[1] = uvec4(atomicCounterDecrement(ac_counter[1]));" NL "}";
		const char* src_fs2 = "#version 310 es" NL "layout(location = 0) out uvec4 o_color[2];" NL
							  "layout(binding = 0) uniform atomic_uint ac_counter[2];" NL "void main() {" NL
							  "  o_color[0] = uvec4(atomicCounter(ac_counter[0]));" NL
							  "  o_color[1] = uvec4(atomicCounter(ac_counter[1]));" NL "}";
		prog_  = CreateProgram(src_vs, src_fs, true);
		prog2_ = CreateProgram(src_vs, src_fs2, true);

		// create atomic counter buffer
		glGenBuffers(1, &counter_buffer_);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, counter_buffer_);
		glBufferData(GL_ATOMIC_COUNTER_BUFFER, 8, NULL, GL_DYNAMIC_COPY);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		// create render targets
		const int s = 8;
		glGenTextures(2, rt_);

		for (int i = 0; i < 2; ++i)
		{
			glBindTexture(GL_TEXTURE_2D, rt_[i]);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexImage2D(GL_TEXTURE_2D, 0, GL_R32UI, s, s, 0, GL_RED_INTEGER, GL_UNSIGNED_INT, NULL);
			glBindTexture(GL_TEXTURE_2D, 0);
		}

		// create fbo
		glGenFramebuffers(1, &fbo_);
		glBindFramebuffer(GL_FRAMEBUFFER, fbo_);
		glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, rt_[0], 0);
		glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT1, GL_TEXTURE_2D, rt_[1], 0);
		const GLenum draw_buffers[2] = { GL_COLOR_ATTACHMENT0, GL_COLOR_ATTACHMENT1 };
		glDrawBuffers(2, draw_buffers);
		glBindFramebuffer(GL_FRAMEBUFFER, 0);

		// create geometry
		CreateQuad(&vao_, &vbo_, NULL);

		// init counter buffer
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, counter_buffer_);
		unsigned int* ptr = static_cast<unsigned int*>(
			glMapBufferRange(GL_ATOMIC_COUNTER_BUFFER, 0, 8, GL_MAP_WRITE_BIT | GL_MAP_INVALIDATE_BUFFER_BIT));
		*ptr++ = 256;
		*ptr++ = 256;
		glUnmapBuffer(GL_ATOMIC_COUNTER_BUFFER);

		// draw
		glBindFramebuffer(GL_FRAMEBUFFER, fbo_);
		glViewport(0, 0, s, s);
		glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 0, counter_buffer_);
		glUseProgram(prog_);
		glBindVertexArray(vao_);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		// update counter buffer
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, counter_buffer_);
		ptr = static_cast<unsigned int*>(
			glMapBufferRange(GL_ATOMIC_COUNTER_BUFFER, 0, 8, GL_MAP_WRITE_BIT | GL_MAP_READ_BIT));
		*ptr++ += 512;
		*ptr++ += 1024;
		glUnmapBuffer(GL_ATOMIC_COUNTER_BUFFER);

		// draw
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);
		glMemoryBarrier(GL_ATOMIC_COUNTER_BARRIER_BIT);

		// draw
		glUseProgram(prog2_);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		// validate
		UVec4 data[s * s];
		glReadBuffer(GL_COLOR_ATTACHMENT0);
		glReadPixels(0, 0, s, s, GL_RGBA_INTEGER, GL_UNSIGNED_INT, data);
		for (int i = 0; i < s * s; ++i)
		{
			if (data[i].x() != 896)
			{
				Output("Counter value is %u should be %u.\n", data[i].x(), 896);
				return ERROR;
			}
		}

		glReadBuffer(GL_COLOR_ATTACHMENT1);
		glReadPixels(0, 0, s, s, GL_RGBA_INTEGER, GL_UNSIGNED_INT, data);
		for (int i = 0; i < s * s; ++i)
		{
			if (data[i].x() != 1152)
			{
				Output("Counter value is %u should be %u.\n", data[i].x(), 896);
				return ERROR;
			}
		}

		if (!CheckFinalCounterValue(counter_buffer_, 0, 896))
			return ERROR;
		if (!CheckFinalCounterValue(counter_buffer_, 4, 1152))
			return ERROR;

		return NO_ERROR;
	}